

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.c
# Opt level: O1

void aom_highbd_subtract_block_c
               (int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,uint8_t *src8,
               ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < rows) {
    lVar3 = (long)pred8 * 2;
    lVar2 = (long)src8 * 2;
    iVar1 = 0;
    do {
      if (0 < cols) {
        uVar4 = 0;
        do {
          diff[uVar4] = *(short *)(lVar2 + uVar4 * 2) - *(short *)(lVar3 + uVar4 * 2);
          uVar4 = uVar4 + 1;
        } while ((uint)cols != uVar4);
      }
      iVar1 = iVar1 + 1;
      diff = diff + diff_stride;
      lVar3 = lVar3 + pred_stride * 2;
      lVar2 = lVar2 + src_stride * 2;
    } while (iVar1 != rows);
  }
  return;
}

Assistant:

void aom_highbd_subtract_block_c(int rows, int cols, int16_t *diff,
                                 ptrdiff_t diff_stride, const uint8_t *src8,
                                 ptrdiff_t src_stride, const uint8_t *pred8,
                                 ptrdiff_t pred_stride) {
  int r, c;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);

  for (r = 0; r < rows; r++) {
    for (c = 0; c < cols; c++) {
      diff[c] = src[c] - pred[c];
    }

    diff += diff_stride;
    pred += pred_stride;
    src += src_stride;
  }
}